

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O0

void __thiscall Opcode::AABBTreeNode::~AABBTreeNode(AABBTreeNode *this)

{
  long lVar1;
  AABBTreeNode *pAVar2;
  AABBTreeNode *this_00;
  AABBTreeNode *Neg;
  AABBTreeNode *Pos;
  AABBTreeNode *this_local;
  AABBTreeNode *P;
  
  pAVar2 = (AABBTreeNode *)(this->mPos & 0xfffffffffffffffe);
  if ((((this->mPos & 1) == 0) && (pAVar2 != (AABBTreeNode *)0x0)) &&
     (pAVar2 != (AABBTreeNode *)0x0)) {
    lVar1 = *(long *)&pAVar2[-1].mNbPrimitives;
    this_00 = pAVar2 + lVar1;
    while (pAVar2 != this_00) {
      this_00 = this_00 + -1;
      ~AABBTreeNode(this_00);
    }
    operator_delete__(&pAVar2[-1].mNbPrimitives,lVar1 * 0x30 + 8);
  }
  this->mNodePrimitives = (udword *)0x0;
  this->mNbPrimitives = 0;
  return;
}

Assistant:

AABBTreeNode::~AABBTreeNode()
{
	// Opcode 1.3:
	const AABBTreeNode* Pos = GetPos();
	const AABBTreeNode* Neg = GetNeg();
#ifndef OPC_NO_NEG_VANILLA_TREE
	if(!(mPos&1))	DELETESINGLE(Pos);
	if(!(mNeg&1))	DELETESINGLE(Neg);
#else
	if(!(mPos&1))	DELETEARRAY(Pos);
#endif
	mNodePrimitives	= null;	// This was just a shortcut to the global list => no release
	mNbPrimitives	= 0;
}